

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_settable(lua_State *L,int idx)

{
  StkId pTVar1;
  int iVar2;
  undefined4 uVar3;
  TValue *t;
  TValue *slot;
  
  t = index2addr(L,idx);
  if (t->tt_ == 0x45) {
    slot = luaH_get((Table *)(t->value_).gc,L->top + -2);
    if (slot->tt_ != 0) {
      if ((((L->top[-1].tt_ & 0x40) != 0) && ((((Table *)(t->value_).gc)->marked & 4) != 0)) &&
         (((L->top[-1].value_.gc)->marked & 3) != 0)) {
        luaC_barrierback_(L,(Table *)(t->value_).gc);
      }
      pTVar1 = L->top;
      iVar2 = pTVar1[-1].tt_;
      uVar3 = *(undefined4 *)&pTVar1[-1].field_0xc;
      slot->value_ = pTVar1[-1].value_;
      slot->tt_ = iVar2;
      *(undefined4 *)&slot->field_0xc = uVar3;
      goto LAB_0010f789;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  luaV_finishset(L,t,L->top + -2,L->top + -1,slot);
LAB_0010f789:
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_settable (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2addr(L, idx);
  luaV_settable(L, t, L->top - 2, L->top - 1);
  L->top -= 2;  /* pop index and value */
  lua_unlock(L);
}